

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.c
# Opt level: O3

char * strtok_r(char *__s,char *__delim,char **__save_ptr)

{
  size_t sVar1;
  char *pcVar2;
  char *__s_00;
  
  if (__s == (char *)0x0) {
    __s = *__save_ptr;
  }
  sVar1 = strspn(__s,__delim);
  if (__s[sVar1] == '\0') {
    __s_00 = (char *)0x0;
  }
  else {
    __s_00 = __s + sVar1;
    sVar1 = strcspn(__s_00,__delim);
    pcVar2 = __s_00 + sVar1;
    if (__s_00[sVar1] != '\0') {
      *pcVar2 = '\0';
      pcVar2 = pcVar2 + 1;
    }
    *__save_ptr = pcVar2;
  }
  return __s_00;
}

Assistant:

char* strtok_r(char* str, const char* delim, char** nextp)
{
  char* ret;

  if (str == NULL)
    str = *nextp;

  str += strspn(str, delim);

  if (*str == '\0')
    return NULL;

  ret = str;
  str += strcspn(str, delim);

  if (*str)
    *str++ = '\0';

  *nextp = str;

  return ret;
}